

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O2

bool __thiscall dap::json::JsonCppSerializer::serialize(JsonCppSerializer *this,any *v)

{
  TypeInfo *pTVar1;
  bool bVar2;
  int iVar3;
  boolean *pbVar4;
  integer *piVar5;
  number *pnVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
  *puVar7;
  Value VStack_38;
  
  bVar2 = any::is<dap::boolean>(v);
  if (bVar2) {
    pbVar4 = any::get<dap::boolean>(v);
    Json::Value::Value(&VStack_38,pbVar4->val);
  }
  else {
    bVar2 = any::is<dap::integer>(v);
    if (bVar2) {
      piVar5 = any::get<dap::integer>(v);
      Json::Value::Value(&VStack_38,piVar5->val);
    }
    else {
      bVar2 = any::is<dap::number>(v);
      if (bVar2) {
        pnVar6 = any::get<dap::number>(v);
        Json::Value::Value(&VStack_38,pnVar6->val);
      }
      else {
        bVar2 = any::is<std::__cxx11::string>(v);
        if (!bVar2) {
          bVar2 = any::
                  is<std::unordered_map<std::__cxx11::string,dap::any,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,dap::any>>>>
                            (v);
          if (bVar2) {
            puVar7 = any::
                     get<std::unordered_map<std::__cxx11::string,dap::any,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,dap::any>>>>
                               (v);
            iVar3 = (*(this->super_Serializer)._vptr_Serializer[6])(this,puVar7);
            return SUB41(iVar3,0);
          }
          if (v->value == (void *)0x0) {
            return true;
          }
          pTVar1 = v->type;
          if (pTVar1 != (TypeInfo *)0x0) {
            iVar3 = (*pTVar1->_vptr_TypeInfo[9])(pTVar1,this);
            return SUB41(iVar3,0);
          }
          return false;
        }
        value = any::get<std::__cxx11::string>(v);
        Json::Value::Value(&VStack_38,value);
      }
    }
  }
  Json::Value::operator=(this->json,&VStack_38);
  Json::Value::~Value(&VStack_38);
  return true;
}

Assistant:

bool JsonCppSerializer::serialize(const dap::any& v) {
  if (v.is<dap::boolean>()) {
    *json = (bool)v.get<dap::boolean>();
  } else if (v.is<dap::integer>()) {
    *json = (Json::LargestInt)v.get<dap::integer>();
  } else if (v.is<dap::number>()) {
    *json = (double)v.get<dap::number>();
  } else if (v.is<dap::string>()) {
    *json = v.get<dap::string>();
  } else if (v.is<dap::object>()) {
    // reachable if dap::object nested is inside other dap::object
    return serialize(v.get<dap::object>());
  } else if (v.is<dap::null>()) {
  } else {
    // reachable if array or custom serialized type is nested inside other
    auto type = get_any_type(v);
    auto value = get_any_val(v);
    if (type && value) {
      return type->serialize(this, value);
    }
    return false;
  }
  return true;
}